

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O1

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>>
          (rt_expression_interface<double> *param_1,
          op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_> param_2,
          rt_expression_interface<double> *param_3)

{
  expression_not_differentiable_exception *this;
  string local_40;
  
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot differentiate runtime integration (yet)!","");
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_40);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_rt_symbolic_integral<InterfaceType>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("Cannot differentiate runtime integration (yet)!");
    return NULL;
  }